

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O2

char * rndcolor(void)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  
  uVar2 = mt_random();
  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
    if (u.umonnum != u.umonster) {
      bVar1 = dmgtype(youmonst.data,0x24);
      if (bVar1 != '\0') goto LAB_0017b184;
    }
    pcVar3 = hcolor((char *)0x0);
    return pcVar3;
  }
LAB_0017b184:
  if ((uVar2 & 0xf) == 8) {
    pcVar3 = "colorless";
  }
  else {
    pcVar3 = c_obj_colors[uVar2 & 0xf];
  }
  return pcVar3;
}

Assistant:

const char *rndcolor(void)
{
	int k = rn2(CLR_MAX);
	return Hallucination ? hcolor(NULL) : (k == NO_COLOR) ?
		"colorless" : c_obj_colors[k];
}